

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase960::run(TestCase960 *this)

{
  PromiseNode *pPVar1;
  WirePointer *pWVar2;
  Event **ppEVar3;
  Disposer *pDVar4;
  TaskSet *pTVar5;
  CapTableBuilder *pCVar6;
  undefined8 uVar7;
  PipelineOp *pPVar8;
  ArrayDisposer *pAVar9;
  RequestHook *pRVar10;
  long *plVar11;
  Impl *pIVar12;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_R8D;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call0;
  Client client;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call1;
  Client cap;
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetNullResults> promise;
  TestContext context;
  undefined1 local_308 [8];
  PromiseNode *local_300;
  Event *local_2f8;
  WirePointer *local_2f0;
  Event **local_2e8;
  Disposer *pDStack_2e0;
  TaskSet *local_2d8;
  undefined1 local_2d0 [16];
  CapTableBuilder *pCStack_2c0;
  undefined1 local_2b8 [32];
  PipelineOp *local_298;
  Disposer *pDStack_290;
  ArrayDisposer *local_288;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_280;
  undefined1 local_248 [16];
  long *local_238;
  undefined1 local_230 [32];
  Disposer *local_210;
  Impl *pIStack_208;
  Disposer *local_200;
  Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  local_1f8 [3];
  undefined8 *local_1c8;
  long *local_1c0;
  Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetNullResults>_>
  local_1b8 [3];
  undefined8 *local_188;
  long *local_180;
  Maybe<capnp::MessageSize> local_178;
  Maybe<capnp::MessageSize> local_160;
  Maybe<capnp::MessageSize> local_148;
  TestContext local_130;
  
  TestContext::TestContext(&local_130);
  TestContext::connect((TestContext *)local_308,(int)&local_130,(sockaddr *)0x5,(socklen_t)in_RCX);
  (*((CapTableReader *)&local_300->_vptr_PromiseNode)->_vptr_CapTableReader[4])(local_230);
  pPVar1 = local_300;
  local_2d0._8_4_ = local_230._0_4_;
  local_2d0._12_4_ = local_230._4_4_;
  pCStack_2c0 = (CapTableBuilder *)local_230._8_8_;
  local_2d0._0_8_ = &capnproto_test::capnp::test::TestMoreStuff::Client::typeinfo;
  if (local_300 != (PromiseNode *)0x0) {
    local_300 = (PromiseNode *)0x0;
    (*(code *)((SegmentReader *)local_308)->arena->_vptr_Arena)
              (local_308,
               ((CapTableReader *)&pPVar1->_vptr_PromiseNode)->_vptr_CapTableReader[-2] +
               (long)&pPVar1->_vptr_PromiseNode);
  }
  local_148.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::getNullRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::GetNullParams,_capnproto_test::capnp::test::TestMoreStuff::GetNullResults>
              *)local_308,(Client *)local_2d0,&local_148);
  Request<capnproto_test::capnp::test::TestMoreStuff::GetNullParams,_capnproto_test::capnp::test::TestMoreStuff::GetNullResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::GetNullParams,_capnproto_test::capnp::test::TestMoreStuff::GetNullResults>
          *)local_230,(int)local_308,__buf,in_RCX,in_R8D);
  pTVar5 = local_2d8;
  if (local_2d8 != (TaskSet *)0x0) {
    local_2d8 = (TaskSet *)0x0;
    (**pDStack_2e0->_vptr_Disposer)
              (pDStack_2e0,
               (long)&pTVar5->errorHandler + (long)pTVar5->errorHandler[-2]._vptr_ErrorHandler);
  }
  capnproto_test::capnp::test::TestMoreStuff::GetNullResults::Pipeline::getNullCap
            ((Client *)local_248,(Pipeline *)(local_230 + 0x10));
  local_160.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_280,
             (Client *)(&((Client *)local_248)->field_0x0 + *(long *)(local_248._0_8_ + -0x20)),
             &local_160);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_308,(int)&local_280,__buf_00,in_RCX,in_R8D);
  pRVar10 = local_280.hook.ptr;
  if ((_Base_ptr)local_280.hook.ptr != (_Base_ptr)0x0) {
    local_280.hook.ptr = (RequestHook *)0x0;
    (**(local_280.hook.disposer)->_vptr_Disposer)
              (local_280.hook.disposer,
               *(long *)(*(long *)pRVar10 + -0x10) + (long)&pRVar10->_vptr_RequestHook);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetNullResults>_>::wait
            (local_1b8,local_230);
  plVar11 = local_180;
  if (local_180 != (long *)0x0) {
    local_180 = (long *)0x0;
    (**(code **)*local_188)(local_188,(long)plVar11 + *(long *)(*plVar11 + -0x10));
  }
  local_178.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)local_2b8,
             (Client *)(&((Client *)local_248)->field_0x0 + *(long *)(local_248._0_8_ + -0x20)),
             &local_178);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send(&local_280,(int)local_2b8,__buf_01,in_RCX,in_R8D);
  pAVar9 = local_288;
  if (local_288 != (ArrayDisposer *)0x0) {
    local_288 = (ArrayDisposer *)0x0;
    (**pDStack_290->_vptr_Disposer)
              (pDStack_290,pAVar9->_vptr_ArrayDisposer[-2] + (long)&pAVar9->_vptr_ArrayDisposer);
  }
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
              *)local_308,&local_130.waitScope);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
              *)&local_280,&local_130.waitScope);
  getCallSequence((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                   *)local_2b8,
                  (Client *)
                  (&((Client *)local_2d0)->field_0x0 +
                  (long)((EventLoop *)(local_2d0._0_8_ + -0x38))->tail),0);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait(local_1f8,local_2b8);
  plVar11 = local_1c0;
  if (local_1c0 != (long *)0x0) {
    local_1c0 = (long *)0x0;
    (**(code **)*local_1c8)(local_1c8,(long)plVar11 + *(long *)(*plVar11 + -0x10));
  }
  pDVar4 = pDStack_290;
  pPVar8 = local_298;
  if (local_298 != (PipelineOp *)0x0) {
    local_298 = (PipelineOp *)0x0;
    pDStack_290 = (Disposer *)0x0;
    (**local_288->_vptr_ArrayDisposer)(local_288,pPVar8,8,pDVar4,pDVar4,0);
  }
  uVar7 = local_2b8._24_8_;
  if ((_Base_ptr)local_2b8._24_8_ != (_Base_ptr)0x0) {
    local_2b8._24_8_ = (_Base_ptr)0x0;
    (*(code *)**(undefined8 **)local_2b8._16_8_)
              (local_2b8._16_8_,(long)(_Rb_tree_color *)uVar7 + *(long *)(*(long *)uVar7 + -0x10));
  }
  uVar7 = local_2b8._8_8_;
  if ((_Base_ptr)local_2b8._8_8_ != (_Base_ptr)0x0) {
    local_2b8._8_8_ = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_2b8._0_8_)->arena->_vptr_Arena)
              (local_2b8._0_8_,(long)(_Rb_tree_color *)uVar7 + *(long *)(*(long *)uVar7 + -0x10));
  }
  pDVar4 = local_280.hook.disposer;
  uVar7 = local_280.super_Builder._builder._32_8_;
  if (local_280.super_Builder._builder._32_8_ != 0) {
    local_280.super_Builder._builder.dataSize = 0;
    local_280.super_Builder._builder.pointerCount = 0;
    local_280.super_Builder._builder._38_2_ = 0;
    local_280.hook.disposer = (Disposer *)0x0;
    (*(code *)*(local_280.hook.ptr)->_vptr_RequestHook)(local_280.hook.ptr,uVar7,8,pDVar4,pDVar4,0);
  }
  pWVar2 = local_280.super_Builder._builder.pointers;
  if (local_280.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_280.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_280.super_Builder._builder.data)
              (local_280.super_Builder._builder.data,
               (long)&(pWVar2->offsetAndKind).value + *(long *)((long)*pWVar2 + -0x10));
  }
  pCVar6 = local_280.super_Builder._builder.capTable;
  if ((_Base_ptr)local_280.super_Builder._builder.capTable != (_Base_ptr)0x0) {
    local_280.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_280.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_280.super_Builder._builder.segment,
      (long)&pCVar6->super_CapTableReader + *(long *)(*(long *)pCVar6 + -0x10));
  }
  pDVar4 = pDStack_2e0;
  ppEVar3 = local_2e8;
  if (local_2e8 != (Event **)0x0) {
    local_2e8 = (Event **)0x0;
    pDStack_2e0 = (Disposer *)0x0;
    (*(code *)local_2d8->errorHandler->_vptr_ErrorHandler)(local_2d8,ppEVar3,8,pDVar4,pDVar4,0);
  }
  pWVar2 = local_2f0;
  if (local_2f0 != (WirePointer *)0x0) {
    local_2f0 = (WirePointer *)0x0;
    (**local_2f8->_vptr_Event)
              (local_2f8,
               (long)&(pWVar2->offsetAndKind).value + (long)*(Event ***)((long)*pWVar2 + -0x10));
  }
  pPVar1 = local_300;
  if (local_300 != (PromiseNode *)0x0) {
    local_300 = (PromiseNode *)0x0;
    (*(code *)((SegmentReader *)local_308)->arena->_vptr_Arena)
              (local_308,
               ((CapTableReader *)&pPVar1->_vptr_PromiseNode)->_vptr_CapTableReader[-2] +
               (long)&((CapTableReader *)&pPVar1->_vptr_PromiseNode)->_vptr_CapTableReader);
  }
  plVar11 = local_238;
  if (local_238 != (long *)0x0) {
    local_238 = (long *)0x0;
    (*(code *)**(undefined8 **)local_248._8_8_)
              (local_248._8_8_,(long)plVar11 + *(long *)(*plVar11 + -0x10));
  }
  pIVar12 = pIStack_208;
  pDVar4 = local_210;
  if (local_210 != (Disposer *)0x0) {
    local_210 = (Disposer *)0x0;
    pIStack_208 = (Impl *)0x0;
    (**local_200->_vptr_Disposer)(local_200,pDVar4,8,pIVar12,pIVar12,0);
  }
  uVar7 = local_230._24_8_;
  if ((TestNetworkAdapter *)local_230._24_8_ != (TestNetworkAdapter *)0x0) {
    local_230._24_8_ = (TestNetworkAdapter *)0x0;
    (**(((TestNetworkAdapterBase *)local_230._16_8_)->super_VatNetworkBase)._vptr_VatNetworkBase)
              (local_230._16_8_,
               (((TestNetworkAdapterBase *)uVar7)->super_VatNetworkBase)._vptr_VatNetworkBase[-2] +
               (long)&(((TestNetworkAdapterBase *)uVar7)->super_VatNetworkBase)._vptr_VatNetworkBase
              );
  }
  uVar7 = local_230._8_8_;
  if ((CapTableBuilder *)local_230._8_8_ != (CapTableBuilder *)0x0) {
    local_230._8_8_ = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_230._4_4_,local_230._0_4_))
              ((undefined8 *)CONCAT44(local_230._4_4_,local_230._0_4_),
               ((CapTableReader *)uVar7)->_vptr_CapTableReader[-2] +
               (long)&((CapTableReader *)uVar7)->_vptr_CapTableReader);
  }
  pCVar6 = pCStack_2c0;
  if (pCStack_2c0 != (CapTableBuilder *)0x0) {
    pCStack_2c0 = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_2d0._12_4_,local_2d0._8_4_))
              ((undefined8 *)CONCAT44(local_2d0._12_4_,local_2d0._8_4_),
               (pCVar6->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&pCVar6->super_CapTableReader);
  }
  TestContext::~TestContext(&local_130);
  return;
}

Assistant:

TEST(Rpc, EmbargoNull) {
  // Set up a situation where we pipeline on a capability that ends up coming back null. This
  // should NOT cause a Disembargo to be sent, but due to a bug in earlier versions of Cap'n Proto,
  // a Disembargo was indeed sent to the null capability, which caused the server to disconnect
  // due to protocol error.

  TestContext context;

  auto client = context.connect(test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF)
      .castAs<test::TestMoreStuff>();

  auto promise = client.getNullRequest().send();

  auto cap = promise.getNullCap();

  auto call0 = cap.getCallSequenceRequest().send();

  promise.wait(context.waitScope);

  auto call1 = cap.getCallSequenceRequest().send();

  expectPromiseThrows(kj::mv(call0), context.waitScope);
  expectPromiseThrows(kj::mv(call1), context.waitScope);

  // Verify that we're still connected (there were no protocol errors).
  getCallSequence(client, 0).wait(context.waitScope);
}